

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O2

void __thiscall itis::AVLTree<int>::clear(AVLTree<int> *this)

{
  AVLTreeNode<int> *__x;
  vector<itis::AVLTreeNode<int>_*,_std::allocator<itis::AVLTreeNode<int>_*>_> stack;
  
  stack.super__Vector_base<itis::AVLTreeNode<int>_*,_std::allocator<itis::AVLTreeNode<int>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stack.super__Vector_base<itis::AVLTreeNode<int>_*,_std::allocator<itis::AVLTreeNode<int>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack.super__Vector_base<itis::AVLTreeNode<int>_*,_std::allocator<itis::AVLTreeNode<int>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->root != (AVLTreeNode<int> *)0x0) {
    std::vector<itis::AVLTreeNode<int>_*,_std::allocator<itis::AVLTreeNode<int>_*>_>::push_back
              (&stack,&this->root);
  }
  while (stack.
         super__Vector_base<itis::AVLTreeNode<int>_*,_std::allocator<itis::AVLTreeNode<int>_*>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         stack.
         super__Vector_base<itis::AVLTreeNode<int>_*,_std::allocator<itis::AVLTreeNode<int>_*>_>.
         _M_impl.super__Vector_impl_data._M_finish) {
    __x = stack.
          super__Vector_base<itis::AVLTreeNode<int>_*,_std::allocator<itis::AVLTreeNode<int>_*>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1];
    stack.super__Vector_base<itis::AVLTreeNode<int>_*,_std::allocator<itis::AVLTreeNode<int>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         stack.
         super__Vector_base<itis::AVLTreeNode<int>_*,_std::allocator<itis::AVLTreeNode<int>_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + -1;
    if (__x->left != (AVLTreeNode<int> *)0x0) {
      std::vector<itis::AVLTreeNode<int>_*,_std::allocator<itis::AVLTreeNode<int>_*>_>::push_back
                (&stack,&__x->left);
    }
    if (__x->right != (value_type)0x0) {
      std::vector<itis::AVLTreeNode<int>_*,_std::allocator<itis::AVLTreeNode<int>_*>_>::push_back
                (&stack,&__x->right);
    }
    this->_size = this->_size + -1;
    operator_delete(__x,0x20);
  }
  this->root = (AVLTreeNode<int> *)0x0;
  std::_Vector_base<itis::AVLTreeNode<int>_*,_std::allocator<itis::AVLTreeNode<int>_*>_>::
  ~_Vector_base(&stack.
                 super__Vector_base<itis::AVLTreeNode<int>_*,_std::allocator<itis::AVLTreeNode<int>_*>_>
               );
  return;
}

Assistant:

void AVLTree<T>::clear() {
    std::vector<AVLTreeNode<T> *> stack;

    if (root != nullptr) {
      stack.push_back(root);
    }

    while (!stack.empty()) {
      AVLTreeNode<T> *node = stack.back();
      stack.pop_back();

      if (node->left != nullptr) {
        stack.push_back(node->left);
      }

      if (node->right != nullptr) {
        stack.push_back(node->right);
      }

      _size--;
      delete node;
    }

    root = nullptr;
  }